

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  undefined8 os_00;
  ostream *poVar1;
  pointer this_00;
  char *permissions_file;
  undefined1 local_1d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_198;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  cmScriptGeneratorIndent local_160;
  cmScriptGeneratorIndent local_15c;
  Indent indentNNN;
  Indent indentNN;
  Indent indentN;
  cmAlphaNum local_120;
  undefined1 local_f0 [8];
  string installedFile;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string installedDir;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  Indent indent_local;
  
  installedDir.field_2._8_8_ = os;
  this_local._4_4_ = indent.Level;
  cmAlphaNum::cmAlphaNum(&local_70,"$ENV{DESTDIR}");
  cmInstallGenerator::ConvertToAbsoluteDestination
            (&local_c0,&(this->super_cmInstallGenerator).Destination);
  cmAlphaNum::cmAlphaNum(&local_a0,&local_c0);
  installedFile.field_2._M_local_buf[0xb] = '/';
  cmStrCat<char>((string *)local_40,&local_70,&local_a0,installedFile.field_2._M_local_buf + 0xb);
  std::__cxx11::string::~string((string *)&local_c0);
  cmAlphaNum::cmAlphaNum(&local_120,(string *)local_40);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&indentN,&this->FileName);
  cmStrCat<>((string *)local_f0,&local_120,(cmAlphaNum *)&indentN);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
  poVar1 = std::operator<<(poVar1,(string *)local_f0);
  std::operator<<(poVar1,"\")\n");
  indentNNN.Level =
       (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  local_15c = cmScriptGeneratorIndent::Next(&indentNNN,2);
  local_160 = cmScriptGeneratorIndent::Next(&local_15c,2);
  local_164 = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"file(DIFFERENT _cmake_export_file_changed FILES\n");
  local_168 = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)local_f0);
  poVar1 = std::operator<<(poVar1,"\"\n");
  local_16c = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->MainImportFile);
  std::operator<<(poVar1,"\")\n");
  local_170 = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"if(_cmake_export_file_changed)\n");
  local_174 = local_15c.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_15c);
  poVar1 = std::operator<<(poVar1,"file(GLOB _cmake_old_config_files \"");
  poVar1 = std::operator<<(poVar1,(string *)local_40);
  this_00 = std::
            unique_ptr<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
            ::operator->(&this->EFGen);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_198,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_198);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_198);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_15c);
  std::operator<<(poVar1,"if(_cmake_old_config_files)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_160);
  std::operator<<(poVar1,
                  "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
                 );
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_160);
  poVar1 = std::operator<<(poVar1,"message(STATUS \"Old export file \\\"");
  poVar1 = std::operator<<(poVar1,(string *)local_f0);
  std::operator<<(poVar1,
                  "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_160);
  std::operator<<(poVar1,"unset(_cmake_old_config_files_text)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_160);
  std::operator<<(poVar1,"file(REMOVE ${_cmake_old_config_files})\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_15c);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_15c);
  std::operator<<(poVar1,"unset(_cmake_old_config_files)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"unset(_cmake_export_file_changed)\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = this_local._4_4_;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar1,"endif()\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,&this->MainImportFile);
  os_00 = installedDir.field_2._8_8_;
  permissions_file = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,(ostream *)os_00,
             &(this->super_cmInstallGenerator).Destination,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d8,false,permissions_file,(char *)0x0,(char *)0x0,(char *)0x0,
             this_local._4_4_,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = cmStrCat(
    "$ENV{DESTDIR}", ConvertToAbsoluteDestination(this->Destination), '/');
  std::string installedFile = cmStrCat(installedDir, this->FileName);
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(_cmake_export_file_changed)\n";
  os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(_cmake_old_config_files)\n";
  os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
  os << indentNNN << R"(message(STATUS "Old export file \")" << installedFile
     << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
  os << indentNNN << "unset(_cmake_old_config_files_text)\n";
  os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
  os << indentNN << "endif()\n";
  os << indentNN << "unset(_cmake_old_config_files)\n";
  os << indentN << "endif()\n";
  os << indentN << "unset(_cmake_export_file_changed)\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}